

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O2

void __thiscall
wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::SmallUnorderedSet<wasm::HeapType,5ul>,(wasm::
Mutability)0,wasm::ModuleUtils::DefaultMap>::doAnalysis(std::function<void(wasm::Function*,wasm::
SmallUnorderedSet<wasm::HeapType,5ul>&)>)::Mapper::Mapper(wasm::Module&,std::map<wasm::
Function*,wasm::SmallUnorderedSet<wasm::HeapType,5ul>,std::less<wasm::Function*>,std::allocator<std
::pair<wasm::Function*const,wasm::SmallUnorderedSet<wasm::HeapType,5ul>>>>&,std::function<void(wasm
::Function*,wasm::SmallUnorderedSet<wasm::HeapType_5ul>__>_
          (void *this,Module *module,Map *map,Func *work)

{
  WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>::WalkerPass
            ((WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_> *)this);
  *(undefined ***)this = &PTR__Mapper_011254a0;
  *(Module **)((long)this + 0x130) = module;
  *(Map **)((long)this + 0x138) = map;
  std::function<void_(wasm::Function_*,_wasm::SmallUnorderedSet<wasm::HeapType,_5UL>_&)>::function
            ((function<void_(wasm::Function_*,_wasm::SmallUnorderedSet<wasm::HeapType,_5UL>_&)> *)
             ((long)this + 0x140),
             (function<void_(wasm::Function_*,_wasm::SmallUnorderedSet<wasm::HeapType,_5UL>_&)> *)
             work);
  return;
}

Assistant:

Mapper(Module& module, Map& map, Func work)
        : module(module), map(map), work(work) {}